

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O1

void __thiscall CT::ContourTracing(CT *this,int x,int y,int i_label,bool b_external)

{
  Mat1b *pMVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined7 in_register_00000081;
  bool b_isolated;
  Point2i crd_cur_point;
  int i_previous_contour_point;
  Point2i s;
  int local_4c [2];
  undefined1 local_44 [8];
  uint local_3c;
  int local_38;
  int local_34;
  
  local_4c[0] = 0;
  local_4c[1] = 0;
  pMVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  *(char *)((long)x + (long)y * **(long **)&pMVar1->field_0x48 + *(long *)&pMVar1->field_0x10) =
       (char)i_label;
  local_3c = (uint)CONCAT71(in_register_00000081,b_external) ^ 7;
  local_38 = x;
  local_34 = y;
  Tracer((CT *)local_44,(Point2i *)this,&local_38,(bool *)&local_3c);
  uVar3 = local_44._4_4_;
  uVar2 = local_44._0_4_;
  do {
    do {
      pMVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      *(char *)((long)(int)local_44._0_4_ +
               (long)(int)local_44._4_4_ * **(long **)&pMVar1->field_0x48 +
               *(long *)&pMVar1->field_0x10) = (char)i_label;
      local_4c[0] = local_44._0_4_;
      local_4c[1] = local_44._4_4_;
      Tracer((CT *)local_44,(Point2i *)this,local_4c,(bool *)&local_3c);
    } while (local_4c[0] != local_38);
  } while ((local_4c[1] != local_34) || (local_44._4_4_ != uVar3 || local_44._0_4_ != uVar2));
  return;
}

Assistant:

void ContourTracing(int x, int y, int i_label, bool b_external) {
        cv::Point2i s(x, y), T, crd_next_point, crd_cur_point;

        // The current point is labeled 
		img_.data[s.y * img_.step[0] + s.x] = i_label;

        bool b_isolated(false);
        int i_previous_contour_point;
        if (b_external)
            i_previous_contour_point = 6;
        else
            i_previous_contour_point = 7;

        // First call to Tracer
        crd_next_point = T = Tracer(s, i_previous_contour_point, b_isolated);
        if (b_isolated)
            return;

        do {
            crd_cur_point = crd_next_point;
            img_.data[crd_cur_point.y * img_.step[0] + crd_cur_point.x] = i_label;
            crd_next_point = Tracer(crd_cur_point, i_previous_contour_point, b_isolated);
        } while (!(crd_cur_point == s && crd_next_point == T));
    }